

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O0

unsigned_long CalculateBlockCRC32(unsigned_long ulCount,uchar *ucBuffer)

{
  unsigned_long uVar1;
  ulong local_30;
  unsigned_long ulCRC;
  unsigned_long ulTemp2;
  unsigned_long ulTemp1;
  uchar *ucBuffer_local;
  unsigned_long ulCount_local;
  
  local_30 = 0;
  ulTemp1 = (unsigned_long)ucBuffer;
  ucBuffer_local = (uchar *)ulCount;
  while (ucBuffer_local != (uchar *)0x0) {
    uVar1 = CRC32Value(((uint)local_30 ^ (uint)*(byte *)ulTemp1) & 0xff);
    local_30 = local_30 >> 8 & 0xffffff ^ uVar1;
    ulTemp1 = ulTemp1 + 1;
    ucBuffer_local = ucBuffer_local + -1;
  }
  return local_30;
}

Assistant:

unsigned long CalculateBlockCRC32( unsigned long ulCount, unsigned char* ucBuffer )
{
    unsigned long ulTemp1;
    unsigned long ulTemp2;
    unsigned long ulCRC = 0;
    while ( ulCount-- != 0 )
    {
        ulTemp1 = ( ulCRC >> 8 ) & 0x00FFFFFFL;
        ulTemp2 = CRC32Value( ((int) ulCRC ^ *ucBuffer++ ) & 0xFF );
        ulCRC = ulTemp1 ^ ulTemp2;
    }
    return( ulCRC );
}